

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.h
# Opt level: O2

UnitQuaternion * expQuaternion(Vector3 omega)

{
  VectorFixSize<4U> *in_RDI;
  RealScalar RVar1;
  double dVar2;
  double dVar3;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  undefined8 *local_20 [2];
  
  iDynTree::VectorFixSize<4U>::zero(in_RDI);
  in_RDI->m_data[0] = 1.0;
  local_20[0] = &stack0x00000008;
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          norm((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_20);
  if ((RVar1 != 0.0) || (NAN(RVar1))) {
    dVar2 = cos(RVar1 * 0.5);
    dVar3 = sin(RVar1 * 0.5);
    dVar3 = dVar3 / RVar1;
    in_RDI->m_data[0] = dVar2;
    in_RDI->m_data[1] = dVar3 * in_stack_00000008;
    in_RDI->m_data[2] = dVar3 * in_stack_00000010;
    in_RDI->m_data[3] = dVar3 * in_stack_00000018;
  }
  return in_RDI;
}

Assistant:

inline iDynTree::UnitQuaternion expQuaternion(iDynTree::Vector3 omega)
{
    iDynTree::UnitQuaternion q;
    q.zero();
    q(0) = 1.0;
    using iDynTree::toEigen;
    double norm{toEigen(omega).norm()};

    if (norm == 0)
    {
        return q;
    }

    double c = std::cos(norm/2);
    double s = std::sin(norm/2)/norm;

    q(0) = c;
    q(1) = omega(0)*s;
    q(2) = omega(1)*s;
    q(3) = omega(2)*s;

    return q;
}